

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubString.cpp
# Opt level: O3

JavascriptString * Js::SubString::New(JavascriptString *string,charcount_t start,charcount_t length)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  int iVar4;
  undefined4 *puVar5;
  char16 *pcVar6;
  undefined4 extraout_var;
  Recycler *alloc;
  JavascriptString *pJVar7;
  StaticType *type;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  bVar2 = IsValidCharCount((ulong)start);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SubString.cpp"
                                ,0x19,"(IsValidCharCount(start))","start is out of range");
    if (!bVar2) goto LAB_00d543ac;
    *puVar5 = 0;
  }
  bVar2 = IsValidCharCount((ulong)length);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SubString.cpp"
                                ,0x1a,"(IsValidCharCount(length))","length is out of range");
    if (!bVar2) goto LAB_00d543ac;
    *puVar5 = 0;
  }
  scriptContext =
       (((((string->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  if (length == 0) {
    pJVar7 = JavascriptLibrary::GetEmptyString
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    return pJVar7;
  }
  data._32_8_ = scriptContext->recycler;
  cVar3 = JavascriptString::GetLength(string);
  if (cVar3 < start + length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SubString.cpp"
                                ,0x24,"(string->GetLength() >= start + length)",
                                "string->GetLength() >= start + length");
    if (!bVar2) {
LAB_00d543ac:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pcVar6 = JavascriptString::GetString(string);
  iVar4 = (*(string->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x66])(string);
  local_68 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_90c1362;
  data.filename._0_4_ = 0x30;
  alloc = Memory::Recycler::TrackAllocInfo((Recycler *)data._32_8_,(TrackAllocData *)local_68);
  pJVar7 = (JavascriptString *)new<Memory::Recycler>(0x30,alloc,0x387914);
  type = StringCache::GetStringTypeStatic
                   (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
  JavascriptString::JavascriptString(pJVar7,type);
  (pJVar7->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01536d88;
  pJVar7[1].super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)0x0;
  pJVar7[1].super_RecyclableObject.type.ptr = (Type *)0x0;
  JavascriptString::SetBuffer(pJVar7,pcVar6 + start);
  Memory::Recycler::WBSetBit((char *)(pJVar7 + 1));
  pJVar7[1].super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)CONCAT44(extraout_var,iVar4);
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pJVar7 + 1);
  JavascriptString::SetLength(pJVar7,length);
  pcVar6 = JavascriptString::UnsafeGetBuffer(pJVar7);
  cVar3 = JavascriptString::GetLength(pJVar7);
  StringProfiler::RecordNewString(scriptContext,pcVar6,cVar3);
  return pJVar7;
}

Assistant:

JavascriptString* SubString::New(JavascriptString* string, charcount_t start, charcount_t length)
    {
        AssertMsg( IsValidCharCount(start), "start is out of range" );
        AssertMsg( IsValidCharCount(length), "length is out of range" );

        ScriptContext *scriptContext = string->GetScriptContext();
        if (!length)
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        Recycler* recycler = scriptContext->GetRecycler();

        AssertOrFailFast(string->GetLength() >= start + length);
        const char16 * subString = string->GetString() + start;
        void const * originalFullStringReference = string->GetOriginalStringReference();

#if SYSINFO_IMAGE_BASE_AVAILABLE
        AssertMsg(AutoSystemInfo::IsJscriptModulePointer((void*)originalFullStringReference)
            || recycler->IsValidObject((void*)originalFullStringReference)
            || (VirtualTableInfo<PropertyRecord>::HasVirtualTable((void*)originalFullStringReference) && ((PropertyRecord*)originalFullStringReference)->IsBound())
            || (string->GetLength() == 1 && originalFullStringReference == scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(string->GetString()[0])->UnsafeGetBuffer()),
            "Owning pointer for SubString must be static or GC pointer, property record bound by thread allocator, or character buffer in global string cache");
#endif

        return RecyclerNew(recycler, SubString, originalFullStringReference, subString, length, scriptContext);
    }